

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_import.cpp
# Opt level: O1

unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>,_true> __thiscall
duckdb::Transformer::TransformImport(Transformer *this,PGImportStmt *stmt)

{
  Transformer *this_00;
  pointer pPVar1;
  pointer pPVar2;
  ConstantExpression *this_01;
  long in_RDX;
  pointer *__ptr_2;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ConstantExpression_*,_false> local_a8;
  Value local_a0;
  Value local_60;
  
  this_00 = (Transformer *)operator_new(0x80);
  PragmaStatement::PragmaStatement((PragmaStatement *)this_00);
  (this->parent).ptr = this_00;
  pPVar1 = unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>,_true>::
           operator->((unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>,_true>
                       *)this);
  pPVar2 = unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true>::operator->
                     (&pPVar1->info);
  ::std::__cxx11::string::_M_replace
            ((ulong)&pPVar2->name,0,(char *)(pPVar2->name)._M_string_length,0x1396640);
  pPVar1 = unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>,_true>::
           operator->((unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>,_true>
                       *)this);
  pPVar2 = unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true>::operator->
                     (&pPVar1->info);
  Value::Value(&local_a0,*(char **)(in_RDX + 8));
  this_01 = (ConstantExpression *)operator_new(0x78);
  Value::Value(&local_60,&local_a0);
  ConstantExpression::ConstantExpression(this_01,&local_60);
  local_a8._M_head_impl = this_01;
  Value::~Value(&local_60);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pPVar2->parameters,
             (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
              *)&local_a8);
  if (local_a8._M_head_impl != (ConstantExpression *)0x0) {
    (*((local_a8._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[1]
    )();
  }
  local_a8._M_head_impl = (ConstantExpression *)0x0;
  Value::~Value(&local_a0);
  return (unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>_>)
         (unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>_>)this;
}

Assistant:

unique_ptr<PragmaStatement> Transformer::TransformImport(duckdb_libpgquery::PGImportStmt &stmt) {
	auto result = make_uniq<PragmaStatement>();
	result->info->name = "import_database";
	result->info->parameters.emplace_back(make_uniq<ConstantExpression>(Value(stmt.filename)));
	return result;
}